

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

uint32 gflags::Uint32FromEnv(char *v,uint32 dflt)

{
  uint uVar1;
  uint32 dflt_local;
  char *v_local;
  
  uVar1 = anon_unknown_2::GetFromEnv<unsigned_int>(v,dflt);
  return uVar1;
}

Assistant:

uint32 Uint32FromEnv(const char *v, uint32 dflt) {
  return GetFromEnv(v, dflt);
}